

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O0

void __thiscall cpp_sgr::sgr::sgr(sgr *this,SGRCode code)

{
  string local_38;
  SGRCode local_14;
  sgr *psStack_10;
  SGRCode code_local;
  sgr *this_local;
  
  local_14 = code;
  psStack_10 = this;
  std::__cxx11::to_string(&local_38,code);
  sgr(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

sgr(const SGRCode code) : sgr(std::to_string(code)) {}